

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t art_size_in_bytes(art_t *art)

{
  _Bool _Var1;
  size_t sVar2;
  long lVar3;
  
  _Var1 = art_is_shrunken(art);
  if (_Var1) {
    sVar2 = 0x38;
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      sVar2 = sVar2 + ART_NODE_SIZES[lVar3 + 1] * art->capacities[lVar3 + 1];
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t art_size_in_bytes(const art_t *art) {
    if (!art_is_shrunken(art)) {
        return 0;
    }
    // Root.
    size_t size = sizeof(art->root);
    // Node counts.
    size += sizeof(art->capacities);
    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size +=
        ((size + alignof(art_leaf_t) - 1) & ~(alignof(art_leaf_t) - 1)) - size;
    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        size += art->capacities[t] * ART_NODE_SIZES[t];
    }
    return size;
}